

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

Mesh * __thiscall
Rml::Geometry::Release(Mesh *__return_storage_ptr__,Geometry *this,ReleaseMode mode)

{
  ReleaseMode mode_local;
  Geometry *this_local;
  Mesh *mesh;
  
  if ((this->
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ).resource_handle == Invalid) {
    memset(__return_storage_ptr__,0,0x30);
    Mesh::Mesh(__return_storage_ptr__);
  }
  else {
    RenderManagerAccess::ReleaseResource<Rml::Geometry>
              (__return_storage_ptr__,
               (this->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).render_manager,this);
    UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::Clear(&this->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
           );
    if (mode == ClearMesh) {
      ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::clear
                (&__return_storage_ptr__->vertices);
      ::std::vector<int,_std::allocator<int>_>::clear(&__return_storage_ptr__->indices);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mesh Geometry::Release(ReleaseMode mode)
{
	if (resource_handle == StableVectorIndex::Invalid)
		return Mesh();

	Mesh mesh = RenderManagerAccess::ReleaseResource(render_manager, *this);
	Clear();
	if (mode == ReleaseMode::ClearMesh)
	{
		mesh.vertices.clear();
		mesh.indices.clear();
	}
	return mesh;
}